

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment.cpp
# Opt level: O3

void __thiscall license::os::ExecutionEnvironment::ExecutionEnvironment(ExecutionEnvironment *this)

{
  char cVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *pcVar3;
  char *pcVar4;
  istream *piVar5;
  long lVar6;
  CONTAINER_TYPE CVar7;
  size_t len;
  char *line;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  char *local_238 [4];
  int aiStack_218 [122];
  
  CpuInfo::CpuInfo(&this->m_cpu_info);
  DmiInfo::DmiInfo(&this->m_dmi_info);
  local_238[0] = (char *)0x0;
  local_258 = (undefined1 *)0x0;
  __stream = fopen("/proc/self/cgroup","r");
  if (__stream != (FILE *)0x0) {
    _Var2 = getline(local_238,(size_t *)&local_258,__stream);
    if (_Var2 == -1) {
      CVar7 = NONE;
    }
    else {
      do {
        pcVar4 = local_238[0];
        pcVar3 = strstr(local_238[0],"docker");
        pcVar4 = strstr(pcVar4,"lxc");
        _Var2 = getline(local_238,(size_t *)&local_258,__stream);
        CVar7 = (CONTAINER_TYPE)(pcVar3 != (char *)0x0);
        if (pcVar4 != (char *)0x0) {
          CVar7 = LXC;
        }
      } while ((_Var2 != -1) && (CVar7 == NONE));
    }
    if (local_238[0] != (char *)0x0) {
      free(local_238[0]);
    }
    fclose(__stream);
    if (CVar7 != NONE) goto LAB_0018b378;
  }
  std::ifstream::ifstream((istream *)local_238,"/var/run/systemd/container",_S_in);
  CVar7 = NONE;
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_250 = 0;
    local_248[0] = 0;
    CVar7 = DOCKER;
    local_258 = local_248;
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar1);
      if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
         (lVar6 = std::__cxx11::string::find((char *)&local_258,0x43b317,0), lVar6 != -1))
      goto LAB_0018b35b;
      lVar6 = std::__cxx11::string::find((char *)&local_258,0x43b31e,0);
    } while (lVar6 == -1);
    CVar7 = LXC;
LAB_0018b35b:
    if (local_258 != local_248) {
      operator_delete(local_258);
    }
  }
  std::ifstream::~ifstream(local_238);
LAB_0018b378:
  this->m_container_type = CVar7;
  return;
}

Assistant:

ExecutionEnvironment::ExecutionEnvironment() : m_container_type(get_container_type()) {}